

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

void __thiscall
Shell::EqualityProxyMono::addCongruenceAxioms(EqualityProxyMono *this,UnitList **units)

{
  TermList arg0;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Symbol *pSVar5;
  OperatorType *pOVar6;
  TermList *args;
  Symbol *this_00;
  Clause *cl_1;
  uint arity_1;
  Symbol *predSym;
  uint i_1;
  uint preds;
  Clause *cl;
  Term *t2;
  Term *t1;
  OperatorType *fnType;
  uint arity;
  Symbol *fnSym;
  uint i;
  uint funs;
  LiteralStack lits;
  Stack<Kernel::TermList> vars2;
  Stack<Kernel::TermList> vars1;
  undefined4 uVar7;
  uint in_stack_fffffffffffffe1c;
  Signature *in_stack_fffffffffffffe20;
  OperatorType *in_stack_fffffffffffffe28;
  Symbol *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  TermList in_stack_fffffffffffffe40;
  TermList in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe60;
  undefined1 polarity;
  uint in_stack_fffffffffffffe70;
  uint predicate;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 skipSortsWithoutEquality;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Clause *in_stack_fffffffffffffe90;
  Stack<Kernel::TermList> *in_stack_fffffffffffffe98;
  TermList in_stack_fffffffffffffea0;
  Term *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint uVar8;
  EqualityProxyMono *in_stack_ffffffffffffff20;
  uint local_d8;
  uint local_88;
  Stack<Kernel::TermList> local_50;
  Stack<Kernel::TermList> local_30;
  
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28)
  ;
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28)
  ;
  Lib::Stack<Kernel::Literal_*>::Stack
            ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28
            );
  uVar2 = Kernel::Signature::functions((Signature *)0xb90f3a);
  for (local_88 = 0; local_88 < uVar2; local_88 = local_88 + 1) {
    pSVar5 = Kernel::Signature::getFunction(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    uVar3 = Kernel::Signature::Symbol::usageCnt(pSVar5);
    if ((uVar3 != 0) && (bVar1 = Kernel::Signature::Symbol::skipCongruence(pSVar5), !bVar1)) {
      uVar3 = Kernel::Signature::Symbol::arity(pSVar5);
      uVar4 = (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      if (uVar3 != 0) {
        pOVar6 = Kernel::Signature::Symbol::fnType(in_stack_fffffffffffffe30);
        uVar7 = 0;
        getArgumentEqualityLiterals
                  ((EqualityProxyMono *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),uVar4,
                   (LiteralStack *)in_stack_fffffffffffffea0._content,in_stack_fffffffffffffe98,
                   (Stack<Kernel::TermList> *)in_stack_fffffffffffffe90,
                   (OperatorType *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
        args = Lib::Stack<Kernel::TermList>::begin(&local_30);
        Kernel::Term::create((uint)((ulong)pOVar6 >> 0x20),(uint)pOVar6,args);
        in_stack_fffffffffffffeb0 = local_88;
        Lib::Stack<Kernel::TermList>::begin(&local_50);
        in_stack_fffffffffffffea8 =
             Kernel::Term::create((uint)((ulong)pOVar6 >> 0x20),(uint)pOVar6,args);
        Kernel::TermList::TermList
                  ((TermList *)in_stack_fffffffffffffe20,
                   (Term *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        Kernel::TermList::TermList
                  ((TermList *)in_stack_fffffffffffffe20,
                   (Term *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        in_stack_fffffffffffffea0 = Kernel::OperatorType::result(in_stack_fffffffffffffe28);
        arg0._content._4_4_ = in_stack_fffffffffffffe54;
        arg0._content._0_4_ = in_stack_fffffffffffffe50;
        in_stack_fffffffffffffe98 =
             (Stack<Kernel::TermList> *)
             makeProxyLiteral((EqualityProxyMono *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0),arg0,
                              in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe20,
                   (Literal *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        in_stack_fffffffffffffe90 =
             createEqProxyAxiom(in_stack_ffffffffffffff20,
                                (LiteralStack *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        Lib::List<Kernel::Unit_*>::push
                  ((Unit *)in_stack_fffffffffffffe20,
                   (List<Kernel::Unit_*> **)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        in_stack_fffffffffffffeb4 = uVar3;
      }
    }
  }
  uVar3 = Kernel::Signature::predicates((Signature *)0xb912b4);
  uVar2 = uVar3;
  for (local_d8 = 1; local_d8 < uVar3; local_d8 = local_d8 + 1) {
    this_00 = Kernel::Signature::getPredicate(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    pSVar5 = this_00;
    uVar4 = Kernel::Signature::Symbol::usageCnt(this_00);
    skipSortsWithoutEquality = (undefined1)((ulong)this_00 >> 0x38);
    if (((uVar4 != 0) && (bVar1 = Kernel::Signature::Symbol::skipCongruence(pSVar5), !bVar1)) &&
       (uVar4 = Kernel::Signature::Symbol::arity(pSVar5), uVar4 != 0)) {
      predicate = uVar4;
      uVar8 = uVar4;
      pOVar6 = Kernel::Signature::Symbol::predType(in_stack_fffffffffffffe30);
      polarity = (undefined1)((ulong)pOVar6 >> 0x38);
      uVar7 = 1;
      bVar1 = getArgumentEqualityLiterals
                        ((EqualityProxyMono *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                         (LiteralStack *)in_stack_fffffffffffffea0._content,
                         in_stack_fffffffffffffe98,
                         (Stack<Kernel::TermList> *)in_stack_fffffffffffffe90,
                         (OperatorType *)CONCAT44(uVar2,in_stack_fffffffffffffe88),
                         (bool)skipSortsWithoutEquality);
      in_stack_fffffffffffffe60 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe60);
      if (bVar1) {
        Lib::Stack<Kernel::TermList>::begin(&local_30);
        Kernel::Literal::create
                  (predicate,in_stack_fffffffffffffe70,(bool)polarity,
                   (TermList *)CONCAT44(uVar4,in_stack_fffffffffffffe60));
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe20,
                   (Literal *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        Lib::Stack<Kernel::TermList>::begin(&local_50);
        in_stack_fffffffffffffe30 =
             (Symbol *)
             Kernel::Literal::create
                       (predicate,in_stack_fffffffffffffe70,(bool)polarity,
                        (TermList *)CONCAT44(uVar4,in_stack_fffffffffffffe60));
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe20,
                   (Literal *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
        createEqProxyAxiom((EqualityProxyMono *)pSVar5,
                           (LiteralStack *)CONCAT44(uVar8,in_stack_ffffffffffffff18));
        Lib::List<Kernel::Unit_*>::push
                  ((Unit *)in_stack_fffffffffffffe20,
                   (List<Kernel::Unit_*> **)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
      }
    }
  }
  Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe20);
  Lib::Stack<Kernel::TermList>::~Stack(&in_stack_fffffffffffffe20->_dividesNvalues);
  Lib::Stack<Kernel::TermList>::~Stack(&in_stack_fffffffffffffe20->_dividesNvalues);
  return;
}

Assistant:

void EqualityProxyMono::addCongruenceAxioms(UnitList*& units)
{
  // This is Krystof Hoder's comment:
  // TODO: skip UPDR predicates!!!
  Stack<TermList> vars1;
  Stack<TermList> vars2;
  LiteralStack lits;

  unsigned funs = env.signature->functions();
  for (unsigned i=0; i<funs; i++) {
    Signature::Symbol* fnSym = env.signature->getFunction(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!fnSym->usageCnt() || fnSym->skipCongruence())
      continue;
    unsigned arity = fnSym->arity();
    if (arity == 0) {
      continue;
    }
    OperatorType* fnType = fnSym->fnType();
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, fnType, false);
    Term* t1 = Term::create(i, arity, vars1.begin());
    Term* t2 = Term::create(i, arity, vars2.begin());
    lits.push(makeProxyLiteral(true, TermList(t1), TermList(t2), fnType->result()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }

  unsigned preds = env.signature->predicates();
  for (unsigned i = 1; i < preds; i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!predSym->usageCnt() || predSym->skipCongruence())
      continue;
    unsigned arity = predSym->arity();
    if (arity == 0) {
      continue;
    }
    if (!getArgumentEqualityLiterals(arity, lits, vars1, vars2, predSym->predType(), true)) {
      continue;
    }
    lits.push(Literal::create(i, arity, false, vars1.begin()));
    lits.push(Literal::create(i, arity, true, vars2.begin()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }
}